

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::NearestNeighborsIndex::SharedDtor(NearestNeighborsIndex *this)

{
  if (this->_oneof_case_[0] != 0) {
    clear_IndexType(this);
  }
  if (this->_oneof_case_[1] != 0) {
    if ((this->_oneof_case_[1] == 200) &&
       ((this->DistanceFunction_).squaredeuclideandistance_ != (SquaredEuclideanDistance *)0x0)) {
      (*(((this->DistanceFunction_).squaredeuclideandistance_)->super_MessageLite)._vptr_MessageLite
        [1])();
    }
    this->_oneof_case_[1] = 0;
  }
  return;
}

Assistant:

void NearestNeighborsIndex::SharedDtor() {
  if (has_IndexType()) {
    clear_IndexType();
  }
  if (has_DistanceFunction()) {
    clear_DistanceFunction();
  }
}